

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix
          (SquareMatrix<double> *this,SquareMatrix<double> *matrix)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  
  lVar1 = matrix->size_;
  this->size_ = lVar1;
  alloc_unique_array<double>((dense *)&this->data_,lVar1 * lVar1);
  pdVar2 = (matrix->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  lVar1 = this->size_;
  pdVar3 = (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  for (uVar4 = 0; uVar4 < (ulong)(lVar1 * lVar1); uVar4 = uVar4 + 1) {
    pdVar3[uVar4] = pdVar2[uVar4];
  }
  return;
}

Assistant:

SquareMatrix( const SquareMatrix< T >& matrix )
        : size_( matrix.size() )
        , data_( alloc_unique_array< T >( size_ * size_ ) )
        {
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
        }